

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseModuleField(WastParser *this,Module *module)

{
  TokenType TVar1;
  Result RVar2;
  
  TVar1 = Peek(this,1);
  if ((int)TVar1 < 0x2a) {
    switch(TVar1) {
    case Elem:
      RVar2 = ParseElemModuleField(this,module);
      return (Result)RVar2.enum_;
    case Eof:
    case Field:
    case Get:
    case Invoke:
    case Input:
    case Local:
    case Lpar:
      break;
    case Tag:
      RVar2 = ParseTagModuleField(this,module);
      return (Result)RVar2.enum_;
    case Export:
      RVar2 = ParseExportModuleField(this,module);
      return (Result)RVar2.enum_;
    case Global:
      RVar2 = ParseGlobalModuleField(this,module);
      return (Result)RVar2.enum_;
    case Import:
      RVar2 = ParseImportModuleField(this,module);
      return (Result)RVar2.enum_;
    case Memory:
      RVar2 = ParseMemoryModuleField(this,module);
      return (Result)RVar2.enum_;
    default:
      if (TVar1 == Data) {
        RVar2 = ParseDataModuleField(this,module);
        return (Result)RVar2.enum_;
      }
    }
  }
  else if ((int)TVar1 < 0x2e) {
    if (TVar1 == Start) {
      RVar2 = ParseStartModuleField(this,module);
      return (Result)RVar2.enum_;
    }
    if (TVar1 == Table) {
      RVar2 = ParseTableModuleField(this,module);
      return (Result)RVar2.enum_;
    }
  }
  else {
    if (TVar1 == Type) {
      RVar2 = ParseTypeModuleField(this,module);
      return (Result)RVar2.enum_;
    }
    if (TVar1 == First_RefKind) {
      RVar2 = ParseFuncModuleField(this,module);
      return (Result)RVar2.enum_;
    }
  }
  __assert_fail("!\"ParseModuleField should only be called if IsModuleField() is true\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0x4db,"Result wabt::WastParser::ParseModuleField(Module *)");
}

Assistant:

Result WastParser::ParseModuleField(Module* module) {
  WABT_TRACE(ParseModuleField);
  switch (Peek(1)) {
    case TokenType::Data:   return ParseDataModuleField(module);
    case TokenType::Elem:   return ParseElemModuleField(module);
    case TokenType::Tag:    return ParseTagModuleField(module);
    case TokenType::Export: return ParseExportModuleField(module);
    case TokenType::Func:   return ParseFuncModuleField(module);
    case TokenType::Type:   return ParseTypeModuleField(module);
    case TokenType::Global: return ParseGlobalModuleField(module);
    case TokenType::Import: return ParseImportModuleField(module);
    case TokenType::Memory: return ParseMemoryModuleField(module);
    case TokenType::Start:  return ParseStartModuleField(module);
    case TokenType::Table:  return ParseTableModuleField(module);
    default:
      assert(
          !"ParseModuleField should only be called if IsModuleField() is true");
      return Result::Error;
  }
}